

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::name(QLocale *this,TagSeparator separator)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  Language LVar1;
  Territory TVar2;
  QLocalePrivate *a;
  byte in_DL;
  qsizetype in_RSI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String_&,_QLatin1Char> QVar3;
  Territory c;
  Language l;
  char sep;
  QLatin1StringView view;
  array<char,_4UL> code;
  undefined4 in_stack_ffffffffffffff18;
  LanguageCodeType in_stack_ffffffffffffff1c;
  QFlags<QLocale::LanguageCodeType> *in_stack_ffffffffffffff20;
  QStringBuilder<QLatin1String_&,_QLatin1Char> *a_00;
  char *in_stack_ffffffffffffff28;
  QLatin1String *this_00;
  QLatin1String *pQVar4;
  undefined1 local_79 [17];
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QLatin1String *local_40;
  char local_38;
  _Type local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_DL < 0x80) {
    local_c[0] = -0x56;
    local_c[1] = -0x56;
    local_c[2] = -0x56;
    local_c[3] = -0x56;
    this_00 = in_RDI;
    pQVar4 = in_RDI;
    a = QSharedDataPointer<QLocalePrivate>::operator->
                  ((QSharedDataPointer<QLocalePrivate> *)0x4c842c);
    QFlags<QLocale::LanguageCodeType>::QFlags(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_c = (_Type)QLocalePrivate::languageCode
                               ((QLocalePrivate *)
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                (QFlagsStorageHelper<QLocale::LanguageCodeType,_4>)SUB84(a,0));
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    std::array<char,_4UL>::data((array<char,_4UL> *)0x4c8486);
    QLatin1String::QLatin1String(this_00,(char *)a);
    LVar1 = language((QLocale *)0x4c84a0);
    if (LVar1 == C) {
      local_68 = local_58;
      local_60 = local_50;
      latin1.m_data = (char *)pQVar4;
      latin1.m_size = in_RSI;
      QString::QString((QString *)this_00,latin1);
    }
    else {
      TVar2 = territory((QLocale *)0x4c84f8);
      if (TVar2 == AnyCountry) {
        local_79._1_8_ = local_58;
        local_79._9_8_ = local_50;
        latin1_00.m_data = (char *)pQVar4;
        latin1_00.m_size = in_RSI;
        QString::QString((QString *)this_00,latin1_00);
      }
      else {
        a_00 = (QStringBuilder<QLatin1String_&,_QLatin1Char> *)local_79;
        QLatin1Char::QLatin1Char((QLatin1Char *)a_00,in_DL);
        QVar3 = ::operator+((QLatin1String *)a,(QLatin1Char *)a_00);
        local_40 = QVar3.a;
        local_38 = (char)QVar3.b.ch;
        QSharedDataPointer<QLocalePrivate>::operator->
                  ((QSharedDataPointer<QLocalePrivate> *)0x4c858b);
        QLocalePrivate::territoryCode((QLocalePrivate *)0x4c8593);
        ::operator+(a_00,(QLatin1String *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<QLatin1String_&,_QLatin1Char>,_QLatin1String> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
    }
  }
  else {
    badSeparatorWarning(in_stack_ffffffffffffff28,(char)((ulong)in_stack_ffffffffffffff20 >> 0x38));
    QString::QString((QString *)0x4c8410);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::name(TagSeparator separator) const
{
    const char sep = char(separator);
    if (uchar(sep) > 0x7f) {
        badSeparatorWarning("name", sep);
        return {};
    }
    const auto code = d->languageCode();
    QLatin1StringView view{code.data()};

    Language l = language();
    if (l == C)
        return view;

    Territory c = territory();
    if (c == AnyTerritory)
        return view;

    return view + QLatin1Char(sep) + d->territoryCode();
}